

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.hpp
# Opt level: O0

ArrowQueryResult * __thiscall duckdb::QueryResult::Cast<duckdb::ArrowQueryResult>(QueryResult *this)

{
  InternalException *this_00;
  ArrowQueryResult *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  if (in_RDI[8] != (ArrowQueryResult)0x3) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"Failed to cast query result to type - query result type mismatch",&local_29
              );
    duckdb::InternalException::InternalException(this_00,local_28);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast query result to type - query result type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}